

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_value.cpp
# Opt level: O1

void __thiscall Json::Path::makePath(Path *this,string *path,InArgs *in)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  char cVar2;
  pointer ppPVar3;
  void *pvVar4;
  char *pcVar5;
  char *pcVar6;
  char *pcVar7;
  allocator local_89;
  Path *local_88;
  InArgs *local_80;
  PathArgument local_78;
  long *local_50 [2];
  long local_40 [2];
  
  if (path->_M_string_length != 0) {
    pcVar6 = (path->_M_dataplus)._M_p;
    pcVar7 = pcVar6 + path->_M_string_length;
    ppPVar3 = (in->
              super__Vector_base<const_Json::PathArgument_*,_std::allocator<const_Json::PathArgument_*>_>
              )._M_impl.super__Vector_impl_data._M_start;
    local_88 = this;
    local_80 = in;
    do {
      cVar2 = *pcVar6;
      if (cVar2 == '%') {
        if ((ppPVar3 !=
             (local_80->
             super__Vector_base<const_Json::PathArgument_*,_std::allocator<const_Json::PathArgument_*>_>
             )._M_impl.super__Vector_impl_data._M_finish) && ((*ppPVar3)->kind_ == kindKey)) {
          std::vector<Json::PathArgument,_std::allocator<Json::PathArgument>_>::push_back
                    (&local_88->args_,*ppPVar3);
        }
LAB_004b8df8:
        pcVar5 = pcVar6 + 1;
      }
      else {
        if (cVar2 == '.') goto LAB_004b8df8;
        pcVar5 = pcVar6;
        if (cVar2 == '[') {
          pcVar5 = pcVar6 + 1;
          if (pcVar6[1] == '%') {
            if ((ppPVar3 !=
                 (local_80->
                 super__Vector_base<const_Json::PathArgument_*,_std::allocator<const_Json::PathArgument_*>_>
                 )._M_impl.super__Vector_impl_data._M_finish) && ((*ppPVar3)->kind_ == kindIndex)) {
              std::vector<Json::PathArgument,_std::allocator<Json::PathArgument>_>::push_back
                        (&local_88->args_,*ppPVar3);
            }
          }
          else {
            paVar1 = &local_78.key_.field_2;
            if (pcVar5 == pcVar7) {
              local_78.index_ = 0;
            }
            else {
              local_78.index_ = 0;
              do {
                if (9 < (byte)(*pcVar5 - 0x30U)) break;
                local_78.index_ = (uint)(byte)(*pcVar5 - 0x30U) + local_78.index_ * 10;
                pcVar5 = pcVar5 + 1;
              } while (pcVar5 != pcVar7);
            }
            local_78.key_._M_string_length = 0;
            local_78.key_.field_2._M_local_buf[0] = '\0';
            local_78.kind_ = kindIndex;
            local_78.key_._M_dataplus._M_p = (pointer)paVar1;
            std::vector<Json::PathArgument,_std::allocator<Json::PathArgument>_>::
            emplace_back<Json::PathArgument>(&local_88->args_,&local_78);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_78.key_._M_dataplus._M_p != paVar1) {
              operator_delete(local_78.key_._M_dataplus._M_p,
                              CONCAT71(local_78.key_.field_2._M_allocated_capacity._1_7_,
                                       local_78.key_.field_2._M_local_buf[0]) + 1);
            }
          }
          pcVar5 = pcVar5 + (pcVar5 != pcVar7);
        }
        else {
          while ((pcVar5 != pcVar7 && (pvVar4 = memchr("[.",(int)*pcVar5,3), pvVar4 == (void *)0x0))
                ) {
            pcVar5 = pcVar5 + 1;
          }
          local_50[0] = local_40;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_50,pcVar6,pcVar5);
          std::__cxx11::string::string((string *)&local_78,(char *)local_50[0],&local_89);
          local_78.index_ = 0;
          local_78.kind_ = kindKey;
          std::vector<Json::PathArgument,_std::allocator<Json::PathArgument>_>::
          emplace_back<Json::PathArgument>(&local_88->args_,&local_78);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_78.key_._M_dataplus._M_p != &local_78.key_.field_2) {
            operator_delete(local_78.key_._M_dataplus._M_p,
                            CONCAT71(local_78.key_.field_2._M_allocated_capacity._1_7_,
                                     local_78.key_.field_2._M_local_buf[0]) + 1);
          }
          if (local_50[0] != local_40) {
            operator_delete(local_50[0],local_40[0] + 1);
          }
        }
      }
      pcVar6 = pcVar5;
    } while (pcVar5 != pcVar7);
  }
  return;
}

Assistant:

void Path::makePath(const std::string& path, const InArgs& in) {
  const char* current = path.c_str();
  const char* end = current + path.length();
  InArgs::const_iterator itInArg = in.begin();
  while (current != end) {
    if (*current == '[') {
      ++current;
      if (*current == '%')
        addPathInArg(path, in, itInArg, PathArgument::kindIndex);
      else {
        ArrayIndex index = 0;
        for (; current != end && *current >= '0' && *current <= '9'; ++current)
          index = index * 10 + ArrayIndex(*current - '0');
        args_.push_back(index);
      }
      if (current == end || *current++ != ']')
        invalidPath(path, int(current - path.c_str()));
    } else if (*current == '%') {
      addPathInArg(path, in, itInArg, PathArgument::kindKey);
      ++current;
    } else if (*current == '.') {
      ++current;
    } else {
      const char* beginName = current;
      while (current != end && !strchr("[.", *current))
        ++current;
      args_.push_back(std::string(beginName, current));
    }
  }
}